

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void lower_bound_sorted_suite::find_odd_last_predicate(void)

{
  undefined4 local_5c;
  array<int,_5UL> storage;
  int local_44;
  int *local_40;
  int *local_38;
  
  storage._M_elems[0] = 0x37;
  storage._M_elems[1] = 0x2c;
  storage._M_elems[2] = 0x21;
  storage._M_elems[3] = 0x16;
  storage._M_elems[4] = 0xb;
  local_5c = 0xc;
  local_40 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&storage,&local_44,&local_5c);
  local_38 = storage._M_elems + 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{})",
             "std::next(storage.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x41f,"void lower_bound_sorted_suite::find_odd_last_predicate()",&local_40,&local_38);
  local_5c = 0xb;
  local_40 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&storage,&local_44,&local_5c);
  local_38 = storage._M_elems + 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{})",
             "std::next(storage.begin(), 4)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x421,"void lower_bound_sorted_suite::find_odd_last_predicate()",&local_40,&local_38);
  local_5c = 10;
  local_40 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&storage,&local_44,&local_5c);
  local_38 = &local_44;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{})",
             "storage.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x423,"void lower_bound_sorted_suite::find_odd_last_predicate()",&local_40,&local_38);
  return;
}

Assistant:

void find_odd_last_predicate()
{
    std::array<int, 5> storage = { 55, 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{}),
                  std::next(storage.begin(), 4));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{}),
                  std::next(storage.begin(), 4));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{}),
                  storage.end());
}